

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong uVar1;
  U32 UVar2;
  U32 UVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  BYTE *local_710;
  BYTE *local_700;
  uint local_6f0;
  uint local_6e8;
  BYTE *local_6e0;
  BYTE *local_6d8;
  BYTE *local_640;
  BYTE *local_630;
  BYTE *local_5a0;
  BYTE *local_590;
  BYTE *local_518;
  BYTE *local_508;
  uint local_4e8;
  uint local_4e4;
  uint local_4e0;
  uint local_4dc;
  uint local_4d8;
  uint local_4d4;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  BYTE *repEnd_3;
  BYTE *repMatch_3;
  BYTE *repBase_3;
  U32 repIndex_3;
  U32 windowLow_3;
  U32 repCurrent;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_3;
  int gain2_3;
  size_t ml2_2;
  size_t ofbCandidate_2;
  int gain1_2;
  int gain2_2;
  size_t repLength_1;
  BYTE *repEnd_2;
  BYTE *repMatch_2;
  BYTE *repBase_2;
  U32 repIndex_2;
  U32 windowLow_2;
  int gain1_1;
  int gain2_1;
  size_t ml2_1;
  size_t ofbCandidate_1;
  int gain1;
  int gain2;
  size_t repLength;
  BYTE *repEnd_1;
  BYTE *repMatch_1;
  BYTE *repBase_1;
  U32 repIndex_1;
  U32 windowLow_1;
  size_t step;
  size_t ml2;
  size_t ofbCandidate;
  BYTE *repEnd;
  BYTE *repMatch;
  BYTE *repBase;
  U32 local_390;
  U32 repIndex;
  U32 windowLow;
  U32 curr;
  BYTE *start;
  size_t offBase;
  size_t matchLength;
  U32 local_368;
  U32 offset_2;
  U32 offset_1;
  U32 rowLog;
  U32 mls;
  U32 windowLog;
  BYTE *dictStart;
  BYTE *dictEnd;
  BYTE *dictBase;
  BYTE *prefixStart;
  BYTE *pBStack_330;
  U32 dictLimit;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  size_t local_2f8;
  void *local_2f0;
  U32 *local_2e8;
  seqStore_t *local_2e0;
  ZSTD_matchState_t *local_2d8;
  U32 row;
  U32 hash;
  U32 lim;
  U32 maxElemsToPrefetch;
  U32 hashLog;
  BYTE *tagTable;
  U32 *hashTable;
  uint local_27c;
  uint local_278;
  U32 row_1;
  U32 hash_1;
  U32 lim_1;
  U32 maxElemsToPrefetch_1;
  U32 hashLog_1;
  BYTE *tagTable_1;
  U32 *hashTable_1;
  uint local_24c;
  U32 local_248;
  U32 local_244;
  BYTE *local_240;
  ZSTD_matchState_t *local_238;
  U64 local_230;
  U32 local_228;
  uint local_224;
  BYTE *local_220;
  size_t local_218;
  U32 local_1f0;
  uint local_1ec;
  BYTE *local_1e8;
  BYTE *local_1e0;
  undefined4 local_1c0;
  int local_1bc;
  U32 local_1b8;
  U32 local_1b4;
  size_t *local_1b0;
  BYTE *local_1a8;
  BYTE *local_1a0;
  ZSTD_matchState_t *local_198;
  ulong local_190;
  undefined4 local_188;
  int local_184;
  U32 local_180;
  U32 local_17c;
  size_t *local_178;
  BYTE *local_170;
  BYTE *local_168;
  ZSTD_matchState_t *local_160;
  size_t local_158;
  undefined4 local_150;
  int local_14c;
  U32 local_148;
  U32 local_144;
  size_t *local_140;
  BYTE *local_138;
  BYTE *local_130;
  ZSTD_matchState_t *local_128;
  ulong local_120;
  BYTE *local_118;
  size_t mlBase_1;
  BYTE *litEnd_1;
  BYTE *litLimit_w_1;
  U32 local_f4;
  BYTE *local_f0;
  BYTE *local_e8;
  ulong local_e0;
  seqStore_t *local_d8;
  BYTE *local_d0;
  size_t mlBase;
  BYTE *litEnd;
  BYTE *litLimit_w;
  U32 local_ac;
  BYTE *local_a8;
  BYTE *local_a0;
  ulong local_98;
  seqStore_t *local_90;
  BYTE *local_88;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  long local_60;
  BYTE *local_58;
  BYTE *local_50;
  BYTE *local_48;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  long local_20;
  BYTE *local_18;
  BYTE *local_10;
  
  ilimit = (BYTE *)((long)src + srcSize);
  base = ilimit + -8;
  pBStack_330 = (ms->window).base;
  prefixStart._4_4_ = (ms->window).dictLimit;
  dictBase = pBStack_330 + prefixStart._4_4_;
  dictEnd = (ms->window).dictBase;
  dictStart = dictEnd + prefixStart._4_4_;
  _mls = dictEnd + (ms->window).lowLimit;
  rowLog = (ms->cParams).windowLog;
  if ((ms->cParams).minMatch < 6) {
    local_4d4 = (ms->cParams).minMatch;
  }
  else {
    local_4d4 = 6;
  }
  if (local_4d4 < 4) {
    local_4d8 = 4;
  }
  else {
    if ((ms->cParams).minMatch < 6) {
      local_4dc = (ms->cParams).minMatch;
    }
    else {
      local_4dc = 6;
    }
    local_4d8 = local_4dc;
  }
  if ((ms->cParams).searchLog < 6) {
    local_4e0 = (ms->cParams).searchLog;
  }
  else {
    local_4e0 = 6;
  }
  if (local_4e0 < 4) {
    local_4e4 = 4;
  }
  else {
    if ((ms->cParams).searchLog < 6) {
      local_4e8 = (ms->cParams).searchLog;
    }
    else {
      local_4e8 = 6;
    }
    local_4e4 = local_4e8;
  }
  local_368 = *rep;
  matchLength._4_4_ = rep[1];
  ms->lazySkipping = 0;
  anchor = (BYTE *)((long)src + (long)(int)(uint)((BYTE *)src == dictBase));
  istart._4_4_ = 0;
  istart._0_4_ = 0;
  offset_1 = local_4d8;
  offset_2 = local_4e4;
  iend = (BYTE *)src;
  ip = (BYTE *)src;
  local_2f8 = srcSize;
  local_2f0 = src;
  local_2e8 = rep;
  local_2e0 = seqStore;
  local_2d8 = ms;
LAB_00e28cc0:
  do {
    if (base <= anchor) {
      *local_2e8 = local_368;
      local_2e8[1] = matchLength._4_4_;
      return (long)ilimit - (long)iend;
    }
    offBase = 0;
    start = (BYTE *)0x1;
    _windowLow = anchor + 1;
    repIndex = (int)anchor - (int)pBStack_330;
    local_390 = ZSTD_getLowestMatchIndex(local_2d8,repIndex + 1,rowLog);
    repBase._4_4_ = (repIndex + 1) - local_368;
    if (repBase._4_4_ < prefixStart._4_4_) {
      local_508 = dictEnd;
    }
    else {
      local_508 = pBStack_330;
    }
    repMatch = local_508;
    repEnd = local_508 + repBase._4_4_;
    if ((prefixStart._4_4_ - 1) - repBase._4_4_ < 3 || (repIndex + 1) - local_390 < local_368) {
LAB_00e28e9c:
      ml2 = 999999999;
      local_128 = local_2d8;
      local_130 = anchor;
      local_138 = ilimit;
      local_140 = &ml2;
      local_144 = offset_1;
      local_148 = offset_2;
      local_14c = istart._4_4_;
      local_150 = 1;
      if (istart._4_4_ == 0) {
        if (offset_1 == 4) {
          local_120 = ZSTD_HcFindBestMatch_extDict_4(local_2d8,anchor,ilimit,local_140);
        }
        else if (offset_1 == 5) {
          local_120 = ZSTD_HcFindBestMatch_extDict_5(local_2d8,anchor,ilimit,local_140);
        }
        else {
          if (offset_1 != 6) goto LAB_00e2981c;
          local_120 = ZSTD_HcFindBestMatch_extDict_6(local_2d8,anchor,ilimit,local_140);
        }
      }
      else if (istart._4_4_ == 1) {
        if (offset_1 == 4) {
          local_120 = ZSTD_BtFindBestMatch_extDict_4(local_2d8,anchor,ilimit,local_140);
        }
        else if (offset_1 == 5) {
          local_120 = ZSTD_BtFindBestMatch_extDict_5(local_2d8,anchor,ilimit,local_140);
        }
        else {
          if (offset_1 != 6) goto LAB_00e2981c;
          local_120 = ZSTD_BtFindBestMatch_extDict_6(local_2d8,anchor,ilimit,local_140);
        }
      }
      else {
        if (istart._4_4_ != 2) {
LAB_00e2981c:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0x5c6,
                        "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                       );
        }
        if (offset_1 == 4) {
          if (offset_2 == 4) {
            local_120 = ZSTD_RowFindBestMatch_extDict_4_4(local_2d8,anchor,ilimit,local_140);
          }
          else if (offset_2 == 5) {
            local_120 = ZSTD_RowFindBestMatch_extDict_4_5(local_2d8,anchor,ilimit,local_140);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c6,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_120 = ZSTD_RowFindBestMatch_extDict_4_6(local_2d8,anchor,ilimit,local_140);
          }
        }
        else if (offset_1 == 5) {
          if (offset_2 == 4) {
            local_120 = ZSTD_RowFindBestMatch_extDict_5_4(local_2d8,anchor,ilimit,local_140);
          }
          else if (offset_2 == 5) {
            local_120 = ZSTD_RowFindBestMatch_extDict_5_5(local_2d8,anchor,ilimit,local_140);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c6,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_120 = ZSTD_RowFindBestMatch_extDict_5_6(local_2d8,anchor,ilimit,local_140);
          }
        }
        else {
          if (offset_1 != 6) goto LAB_00e2981c;
          if (offset_2 == 4) {
            local_120 = ZSTD_RowFindBestMatch_extDict_6_4(local_2d8,anchor,ilimit,local_140);
          }
          else if (offset_2 == 5) {
            local_120 = ZSTD_RowFindBestMatch_extDict_6_5(local_2d8,anchor,ilimit,local_140);
          }
          else {
            if (offset_2 != 6) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c6,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            local_120 = ZSTD_RowFindBestMatch_extDict_6_6(local_2d8,anchor,ilimit,local_140);
          }
        }
      }
      step = local_120;
      if (offBase < local_120) {
        offBase = local_120;
        _windowLow = anchor;
        start = (BYTE *)ml2;
      }
      if (offBase < 4) {
        _repIndex_1 = (ulong)((long)anchor - (long)iend) >> 8;
        anchor = anchor + _repIndex_1 + 1;
        local_2d8->lazySkipping = (uint)(8 < _repIndex_1);
        goto LAB_00e28cc0;
      }
      if ((int)istart != 0) {
        while (anchor < base) {
          anchor = anchor + 1;
          repIndex = repIndex + 1;
          if (start != (BYTE *)0x0) {
            repBase_1._4_4_ = ZSTD_getLowestMatchIndex(local_2d8,repIndex,rowLog);
            repBase_1._0_4_ = repIndex - local_368;
            if ((uint)repBase_1 < prefixStart._4_4_) {
              local_590 = dictEnd;
            }
            else {
              local_590 = pBStack_330;
            }
            repMatch_1 = local_590;
            repEnd_1 = local_590 + (uint)repBase_1;
            if (2 < (prefixStart._4_4_ - 1) - (uint)repBase_1 &&
                local_368 <= repIndex - repBase_1._4_4_) {
              UVar2 = MEM_read32(anchor);
              UVar3 = MEM_read32(repEnd_1);
              if (UVar2 == UVar3) {
                if ((uint)repBase_1 < prefixStart._4_4_) {
                  local_5a0 = dictStart;
                }
                else {
                  local_5a0 = ilimit;
                }
                repLength = (size_t)local_5a0;
                sVar7 = ZSTD_count_2segments(anchor + 4,repEnd_1 + 4,ilimit,local_5a0,dictBase);
                _gain1 = sVar7 + 4;
                ofbCandidate_1._4_4_ = (int)_gain1 * 3;
                iVar5 = (int)offBase;
                uVar6 = ZSTD_highbit32((U32)start);
                ofbCandidate_1._0_4_ = (iVar5 * 3 - uVar6) + 1;
                if ((3 < _gain1) && ((int)ofbCandidate_1 < ofbCandidate_1._4_4_)) {
                  offBase = _gain1;
                  start = (BYTE *)0x1;
                  _windowLow = anchor;
                }
              }
            }
          }
          ml2_1 = 999999999;
          local_160 = local_2d8;
          local_168 = anchor;
          local_170 = ilimit;
          local_178 = &ml2_1;
          local_17c = offset_1;
          local_180 = offset_2;
          local_184 = istart._4_4_;
          local_188 = 1;
          if (istart._4_4_ == 0) {
            if (offset_1 == 4) {
              local_158 = ZSTD_HcFindBestMatch_extDict_4(local_2d8,anchor,ilimit,local_178);
            }
            else if (offset_1 == 5) {
              local_158 = ZSTD_HcFindBestMatch_extDict_5(local_2d8,anchor,ilimit,local_178);
            }
            else {
              if (offset_1 != 6) goto LAB_00e2adee;
              local_158 = ZSTD_HcFindBestMatch_extDict_6(local_2d8,anchor,ilimit,local_178);
            }
          }
          else if (istart._4_4_ == 1) {
            if (offset_1 == 4) {
              local_158 = ZSTD_BtFindBestMatch_extDict_4(local_2d8,anchor,ilimit,local_178);
            }
            else if (offset_1 == 5) {
              local_158 = ZSTD_BtFindBestMatch_extDict_5(local_2d8,anchor,ilimit,local_178);
            }
            else {
              if (offset_1 != 6) goto LAB_00e2adee;
              local_158 = ZSTD_BtFindBestMatch_extDict_6(local_2d8,anchor,ilimit,local_178);
            }
          }
          else {
            if (istart._4_4_ != 2) {
LAB_00e2adee:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                            ,0x5c6,
                            "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                           );
            }
            if (offset_1 == 4) {
              if (offset_2 == 4) {
                local_158 = ZSTD_RowFindBestMatch_extDict_4_4(local_2d8,anchor,ilimit,local_178);
              }
              else if (offset_2 == 5) {
                local_158 = ZSTD_RowFindBestMatch_extDict_4_5(local_2d8,anchor,ilimit,local_178);
              }
              else {
                if (offset_2 != 6) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                ,0x5c6,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                local_158 = ZSTD_RowFindBestMatch_extDict_4_6(local_2d8,anchor,ilimit,local_178);
              }
            }
            else if (offset_1 == 5) {
              if (offset_2 == 4) {
                local_158 = ZSTD_RowFindBestMatch_extDict_5_4(local_2d8,anchor,ilimit,local_178);
              }
              else if (offset_2 == 5) {
                local_158 = ZSTD_RowFindBestMatch_extDict_5_5(local_2d8,anchor,ilimit,local_178);
              }
              else {
                if (offset_2 != 6) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                ,0x5c6,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                local_158 = ZSTD_RowFindBestMatch_extDict_5_6(local_2d8,anchor,ilimit,local_178);
              }
            }
            else {
              if (offset_1 != 6) goto LAB_00e2adee;
              if (offset_2 == 4) {
                local_158 = ZSTD_RowFindBestMatch_extDict_6_4(local_2d8,anchor,ilimit,local_178);
              }
              else if (offset_2 == 5) {
                local_158 = ZSTD_RowFindBestMatch_extDict_6_5(local_2d8,anchor,ilimit,local_178);
              }
              else {
                if (offset_2 != 6) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                ,0x5c6,
                                "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                               );
                }
                local_158 = ZSTD_RowFindBestMatch_extDict_6_6(local_2d8,anchor,ilimit,local_178);
              }
            }
          }
          _gain1_1 = local_158;
          lVar8 = local_158 << 2;
          uVar6 = ZSTD_highbit32((U32)ml2_1);
          windowLow_2 = (int)lVar8 - uVar6;
          lVar8 = offBase << 2;
          uVar6 = ZSTD_highbit32((U32)start);
          repIndex_2 = ((int)lVar8 - uVar6) + 4;
          if ((_gain1_1 < 4) || ((int)windowLow_2 <= (int)repIndex_2)) {
            if (((int)istart != 2) || (base <= anchor)) break;
            anchor = anchor + 1;
            repIndex = repIndex + 1;
            if (start != (BYTE *)0x0) {
              repBase_2._4_4_ = ZSTD_getLowestMatchIndex(local_2d8,repIndex,rowLog);
              repBase_2._0_4_ = repIndex - local_368;
              if ((uint)repBase_2 < prefixStart._4_4_) {
                local_630 = dictEnd;
              }
              else {
                local_630 = pBStack_330;
              }
              repMatch_2 = local_630;
              repEnd_2 = local_630 + (uint)repBase_2;
              if (2 < (prefixStart._4_4_ - 1) - (uint)repBase_2 &&
                  local_368 <= repIndex - repBase_2._4_4_) {
                UVar2 = MEM_read32(anchor);
                UVar3 = MEM_read32(repEnd_2);
                if (UVar2 == UVar3) {
                  if ((uint)repBase_2 < prefixStart._4_4_) {
                    local_640 = dictStart;
                  }
                  else {
                    local_640 = ilimit;
                  }
                  repLength_1 = (size_t)local_640;
                  sVar7 = ZSTD_count_2segments(anchor + 4,repEnd_2 + 4,ilimit,local_640,dictBase);
                  _gain1_2 = sVar7 + 4;
                  ofbCandidate_2._4_4_ = (int)_gain1_2 * 4;
                  lVar8 = offBase << 2;
                  uVar6 = ZSTD_highbit32((U32)start);
                  ofbCandidate_2._0_4_ = ((int)lVar8 - uVar6) + 1;
                  if ((3 < _gain1_2) && ((int)ofbCandidate_2 < ofbCandidate_2._4_4_)) {
                    offBase = _gain1_2;
                    start = (BYTE *)0x1;
                    _windowLow = anchor;
                  }
                }
              }
            }
            ml2_2 = 999999999;
            local_198 = local_2d8;
            local_1a0 = anchor;
            local_1a8 = ilimit;
            local_1b0 = &ml2_2;
            local_1b4 = offset_1;
            local_1b8 = offset_2;
            local_1bc = istart._4_4_;
            local_1c0 = 1;
            if (istart._4_4_ == 0) {
              if (offset_1 == 4) {
                local_190 = ZSTD_HcFindBestMatch_extDict_4(local_2d8,anchor,ilimit,local_1b0);
              }
              else if (offset_1 == 5) {
                local_190 = ZSTD_HcFindBestMatch_extDict_5(local_2d8,anchor,ilimit,local_1b0);
              }
              else {
                if (offset_1 != 6) goto LAB_00e2c3dc;
                local_190 = ZSTD_HcFindBestMatch_extDict_6(local_2d8,anchor,ilimit,local_1b0);
              }
            }
            else if (istart._4_4_ == 1) {
              if (offset_1 == 4) {
                local_190 = ZSTD_BtFindBestMatch_extDict_4(local_2d8,anchor,ilimit,local_1b0);
              }
              else if (offset_1 == 5) {
                local_190 = ZSTD_BtFindBestMatch_extDict_5(local_2d8,anchor,ilimit,local_1b0);
              }
              else {
                if (offset_1 != 6) goto LAB_00e2c3dc;
                local_190 = ZSTD_BtFindBestMatch_extDict_6(local_2d8,anchor,ilimit,local_1b0);
              }
            }
            else {
              if (istart._4_4_ != 2) {
LAB_00e2c3dc:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                              ,0x5c6,
                              "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                             );
              }
              if (offset_1 == 4) {
                if (offset_2 == 4) {
                  local_190 = ZSTD_RowFindBestMatch_extDict_4_4(local_2d8,anchor,ilimit,local_1b0);
                }
                else if (offset_2 == 5) {
                  local_190 = ZSTD_RowFindBestMatch_extDict_4_5(local_2d8,anchor,ilimit,local_1b0);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c6,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_190 = ZSTD_RowFindBestMatch_extDict_4_6(local_2d8,anchor,ilimit,local_1b0);
                }
              }
              else if (offset_1 == 5) {
                if (offset_2 == 4) {
                  local_190 = ZSTD_RowFindBestMatch_extDict_5_4(local_2d8,anchor,ilimit,local_1b0);
                }
                else if (offset_2 == 5) {
                  local_190 = ZSTD_RowFindBestMatch_extDict_5_5(local_2d8,anchor,ilimit,local_1b0);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c6,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_190 = ZSTD_RowFindBestMatch_extDict_5_6(local_2d8,anchor,ilimit,local_1b0);
                }
              }
              else {
                if (offset_1 != 6) goto LAB_00e2c3dc;
                if (offset_2 == 4) {
                  local_190 = ZSTD_RowFindBestMatch_extDict_6_4(local_2d8,anchor,ilimit,local_1b0);
                }
                else if (offset_2 == 5) {
                  local_190 = ZSTD_RowFindBestMatch_extDict_6_5(local_2d8,anchor,ilimit,local_1b0);
                }
                else {
                  if (offset_2 != 6) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                                  ,0x5c6,
                                  "size_t ZSTD_searchMax(ZSTD_matchState_t *, const BYTE *, const BYTE *, size_t *, const U32, const U32, const searchMethod_e, const ZSTD_dictMode_e)"
                                 );
                  }
                  local_190 = ZSTD_RowFindBestMatch_extDict_6_6(local_2d8,anchor,ilimit,local_1b0);
                }
              }
            }
            uVar1 = local_190;
            lVar8 = local_190 << 2;
            uVar6 = ZSTD_highbit32((U32)ml2_2);
            lVar9 = offBase << 2;
            uVar4 = ZSTD_highbit32((U32)start);
            if ((uVar1 < 4) || ((int)((int)lVar8 - uVar6) <= (int)(((int)lVar9 - uVar4) + 7)))
            break;
            offBase = uVar1;
            start = (BYTE *)ml2_2;
            _windowLow = anchor;
          }
          else {
            offBase = _gain1_1;
            start = (BYTE *)ml2_1;
            _windowLow = anchor;
          }
        }
      }
      if ((BYTE *)0x3 < start) {
        if (start < (BYTE *)0x4) {
          __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0x806,
                        "size_t ZSTD_compressBlock_lazy_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32)"
                       );
        }
        uVar6 = ((int)_windowLow - (int)pBStack_330) - ((int)start + -3);
        if (uVar6 < prefixStart._4_4_) {
          local_6d8 = dictEnd + uVar6;
        }
        else {
          local_6d8 = pBStack_330 + uVar6;
        }
        mStart = local_6d8;
        if (uVar6 < prefixStart._4_4_) {
          local_6e0 = _mls;
        }
        else {
          local_6e0 = dictBase;
        }
        while( true ) {
          bVar10 = false;
          if ((iend < _windowLow) && (bVar10 = false, local_6e0 < mStart)) {
            bVar10 = _windowLow[-1] == mStart[-1];
          }
          if (!bVar10) break;
          _windowLow = _windowLow + -1;
          mStart = mStart + -1;
          offBase = offBase + 1;
        }
        matchLength._4_4_ = local_368;
        if (start < (BYTE *)0x4) {
          __assert_fail("OFFBASE_IS_OFFSET(offBase)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0x80a,
                        "size_t ZSTD_compressBlock_lazy_extDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32)"
                       );
        }
        local_368 = (int)start - 3;
      }
    }
    else {
      UVar2 = MEM_read32(anchor + 1);
      UVar3 = MEM_read32(repEnd);
      if (UVar2 != UVar3) goto LAB_00e28e9c;
      if (repBase._4_4_ < prefixStart._4_4_) {
        local_518 = dictStart;
      }
      else {
        local_518 = ilimit;
      }
      ofbCandidate = (size_t)local_518;
      sVar7 = ZSTD_count_2segments(anchor + 5,repEnd + 4,ilimit,local_518,dictBase);
      offBase = sVar7 + 4;
      if ((int)istart != 0) goto LAB_00e28e9c;
    }
    local_98 = (long)_windowLow - (long)iend;
    local_90 = local_2e0;
    local_a0 = iend;
    local_a8 = ilimit;
    local_ac = (U32)start;
    litLimit_w = (BYTE *)offBase;
    litEnd = ilimit + -0x20;
    mlBase = (size_t)(iend + local_98);
    if (local_2e0->maxNbSeq <=
        (ulong)((long)local_2e0->sequences - (long)local_2e0->sequencesStart >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < local_2e0->maxNbLit) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_2e0->litStart + local_2e0->maxNbLit < local_2e0->lit + local_98) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (ilimit < iend + local_98) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (litEnd < mlBase) {
      ZSTD_safecopyLiterals(local_2e0->lit,iend,(BYTE *)mlBase,litEnd);
    }
    else {
      ZSTD_copy16(local_2e0->lit,iend);
      if (0x10 < local_98) {
        oend = local_90->lit + 0x10;
        op = local_a0 + 0x10;
        local_60 = local_98 - 0x10;
        diff._4_4_ = 0;
        ip_1 = oend + -(long)op;
        local_88 = oend + local_60;
        local_58 = op;
        local_50 = oend;
        if (((long)ip_1 < 0x10) && (-0x10 < (long)ip_1)) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        ZSTD_copy16(oend,op);
        if (0x10 < local_60) {
          oend = oend + 0x10;
          op = op + 0x10;
          do {
            ZSTD_copy16(oend,op);
            oend = oend + 0x10;
            op = op + 0x10;
            ZSTD_copy16(oend,op);
            oend = oend + 0x10;
            op = op + 0x10;
          } while (oend < local_88);
        }
      }
    }
    local_90->lit = local_90->lit + local_98;
    if (0xffff < local_98) {
      if (local_90->longLengthType != ZSTD_llt_none) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2b2,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_90->longLengthType = ZSTD_llt_literalLength;
      local_90->longLengthPos =
           (U32)((long)local_90->sequences - (long)local_90->sequencesStart >> 3);
    }
    local_90->sequences->litLength = (U16)local_98;
    local_90->sequences->offBase = local_ac;
    if (litLimit_w < (BYTE *)0x3) {
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_d0 = litLimit_w + -3;
    if ((BYTE *)0xffff < local_d0) {
      if (local_90->longLengthType != ZSTD_llt_none) {
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_90->longLengthType = ZSTD_llt_matchLength;
      local_90->longLengthPos =
           (U32)((long)local_90->sequences - (long)local_90->sequencesStart >> 3);
    }
    local_90->sequences->mlBase = (U16)local_d0;
    local_90->sequences = local_90->sequences + 1;
    iend = _windowLow + offBase;
    anchor = iend;
    if (local_2d8->lazySkipping != 0) {
      if (istart._4_4_ == 2) {
        local_24c = local_2d8->nextToUpdate;
        local_238 = local_2d8;
        local_240 = pBStack_330;
        local_244 = offset_2;
        local_248 = offset_1;
        hashTable_1 = (U32 *)base;
        tagTable_1 = (BYTE *)local_2d8->hashTable;
        _maxElemsToPrefetch_1 = local_2d8->tagTable;
        lim_1 = local_2d8->rowHashLog;
        if (base < pBStack_330 + local_24c) {
          local_6e8 = 0;
        }
        else {
          local_6e8 = ((int)base - ((int)pBStack_330 + local_24c)) + 1;
        }
        hash_1 = local_6e8;
        if (local_6e8 < 9) {
          local_6f0 = local_6e8;
        }
        else {
          local_6f0 = 8;
        }
        row_1 = local_24c + local_6f0;
        for (; local_24c < row_1; local_24c = local_24c + 1) {
          local_220 = local_240 + local_24c;
          local_224 = lim_1 + 8;
          local_230 = local_238->hashSalt;
          local_228 = local_248;
          if (0x20 < local_224) {
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
          }
          switch(local_248) {
          default:
            local_218 = ZSTD_hash4PtrS(local_220,local_224,(U32)local_230);
            break;
          case 5:
            local_218 = ZSTD_hash5PtrS(local_220,local_224,local_230);
            break;
          case 6:
            local_218 = ZSTD_hash6PtrS(local_220,local_224,local_230);
            break;
          case 7:
            local_218 = ZSTD_hash7PtrS(local_220,local_224,local_230);
            break;
          case 8:
            local_218 = ZSTD_hash8PtrS(local_220,local_224,local_230);
          }
          local_278 = (uint)local_218;
          local_27c = (local_278 >> 8) << ((byte)local_244 & 0x1f);
          local_1e0 = tagTable_1;
          local_1e8 = _maxElemsToPrefetch_1;
          local_1f0 = local_244;
          local_1ec = local_27c;
          if (((local_244 != 4) && (local_244 != 5)) && (local_244 != 6)) {
            __assert_fail("rowLog == 4 || rowLog == 5 || rowLog == 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                          ,0x32d,
                          "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)")
            ;
          }
          iVar5 = ZSTD_isAligned(tagTable_1 + (ulong)local_27c * 4,0x40);
          if (iVar5 == 0) {
            __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                          ,0x32e,
                          "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)")
            ;
          }
          iVar5 = ZSTD_isAligned(local_1e8 + local_1ec,1L << ((byte)local_1f0 & 0x3f));
          if (iVar5 == 0) {
            __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                          ,0x32f,
                          "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)")
            ;
          }
          local_238->hashCache[local_24c & 7] = local_278;
        }
      }
      local_2d8->lazySkipping = 0;
    }
    while (anchor <= base) {
      UVar2 = (int)anchor - (int)pBStack_330;
      UVar3 = ZSTD_getLowestMatchIndex(local_2d8,UVar2,rowLog);
      uVar6 = UVar2 - matchLength._4_4_;
      if (uVar6 < prefixStart._4_4_) {
        local_700 = dictEnd;
      }
      else {
        local_700 = pBStack_330;
      }
      if ((prefixStart._4_4_ - 1) - uVar6 < 3 || UVar2 - UVar3 < matchLength._4_4_) break;
      UVar2 = MEM_read32(anchor);
      UVar3 = MEM_read32(local_700 + uVar6);
      if (UVar2 != UVar3) break;
      if (uVar6 < prefixStart._4_4_) {
        local_710 = dictStart;
      }
      else {
        local_710 = ilimit;
      }
      sVar7 = ZSTD_count_2segments(anchor + 4,local_700 + uVar6 + 4,ilimit,local_710,dictBase);
      uVar6 = matchLength._4_4_;
      offBase = sVar7 + 4;
      start = (BYTE *)(ulong)matchLength._4_4_;
      matchLength._4_4_ = local_368;
      local_368 = uVar6;
      local_d8 = local_2e0;
      local_e0 = 0;
      local_e8 = iend;
      local_f0 = ilimit;
      local_f4 = 1;
      litEnd_1 = ilimit + -0x20;
      mlBase_1 = (size_t)iend;
      litLimit_w_1 = (BYTE *)offBase;
      if (local_2e0->maxNbSeq <=
          (ulong)((long)local_2e0->sequences - (long)local_2e0->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < local_2e0->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_2e0->litStart + local_2e0->maxNbLit < local_2e0->lit) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (ilimit < iend) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (litEnd_1 < iend) {
        ZSTD_safecopyLiterals(local_2e0->lit,iend,iend,litEnd_1);
      }
      else {
        ZSTD_copy16(local_2e0->lit,iend);
        if (0x10 < local_e0) {
          oend_1 = local_d8->lit + 0x10;
          op_1 = local_e8 + 0x10;
          local_20 = local_e0 - 0x10;
          diff_1._4_4_ = 0;
          ip_2 = oend_1 + -(long)op_1;
          local_48 = oend_1 + local_20;
          local_18 = op_1;
          local_10 = oend_1;
          if (((long)ip_2 < 0x10) && (-0x10 < (long)ip_2)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          ZSTD_copy16(oend_1,op_1);
          if (0x10 < local_20) {
            oend_1 = oend_1 + 0x10;
            op_1 = op_1 + 0x10;
            do {
              ZSTD_copy16(oend_1,op_1);
              oend_1 = oend_1 + 0x10;
              op_1 = op_1 + 0x10;
              ZSTD_copy16(oend_1,op_1);
              oend_1 = oend_1 + 0x10;
              op_1 = op_1 + 0x10;
            } while (oend_1 < local_48);
          }
        }
      }
      local_d8->lit = local_d8->lit + local_e0;
      if (0xffff < local_e0) {
        if (local_d8->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d8->longLengthType = ZSTD_llt_literalLength;
        local_d8->longLengthPos =
             (U32)((long)local_d8->sequences - (long)local_d8->sequencesStart >> 3);
      }
      local_d8->sequences->litLength = (U16)local_e0;
      local_d8->sequences->offBase = local_f4;
      if (litLimit_w_1 < (BYTE *)0x3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_118 = litLimit_w_1 + -3;
      if ((BYTE *)0xffff < local_118) {
        if (local_d8->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_d8->longLengthType = ZSTD_llt_matchLength;
        local_d8->longLengthPos =
             (U32)((long)local_d8->sequences - (long)local_d8->sequencesStart >> 3);
      }
      local_d8->sequences->mlBase = (U16)local_118;
      local_d8->sequences = local_d8->sequences + 1;
      iend = anchor + offBase;
      anchor = iend;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0);
}